

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O2

Expression * __thiscall GetTupleElement::visit_intrinsic(GetTupleElement *this,Intrinsic *intrinsic)

{
  bool bVar1;
  Expression *pEVar2;
  StringView local_28;
  
  local_28.string = "reference";
  local_28.length = StringView::strlen("reference");
  bVar1 = Intrinsic::name_equals(intrinsic,&local_28);
  if (bVar1) {
    pEVar2 = visit<Expression_const*>
                       (&this->super_Visitor<const_Expression_*>,
                        *(intrinsic->arguments).
                         super__Vector_base<const_Expression_*,_std::allocator<const_Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    pEVar2 = (Expression *)0x0;
  }
  return pEVar2;
}

Assistant:

const Expression* visit_intrinsic(const Intrinsic& intrinsic) override {
		if (intrinsic.name_equals("reference")) {
			return visit(*this, intrinsic.get_arguments()[0]);
		}
		return nullptr;
	}